

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineBlocker.cpp
# Opt level: O0

bool __thiscall ApprovalTests::MachineBlocker::isBlockingOnThisMachine(MachineBlocker *this)

{
  __type _Var1;
  long in_RDI;
  __type isMachine;
  string local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  SystemUtils::getMachineName_abi_cxx11_();
  _Var1 = ::std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string(local_30);
  return _Var1 == (__type)(*(byte *)(in_RDI + 0x28) & 1);
}

Assistant:

bool MachineBlocker::isBlockingOnThisMachine() const
    {
        const auto isMachine = (SystemUtils::getMachineName() == machineName);
        return isMachine == block;
    }